

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSpeedup.c
# Opt level: O0

void Gia_ManSpeedupObj(Gia_Man_t *pNew,Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vLeaves,
                      Vec_Int_t *vTimes)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Gia_Obj_t *pObj_00;
  Vec_Int_t *vNodes_00;
  bool bVar5;
  int iObj;
  int iResult;
  int k;
  int i;
  int nSkip;
  int nCofs;
  int pCofs [32];
  Gia_Obj_t *local_40;
  Gia_Obj_t *pTemp;
  Vec_Int_t *vNodes;
  Vec_Int_t *vTimes_local;
  Vec_Int_t *vLeaves_local;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  Gia_Man_t *pNew_local;
  
  local_40 = (Gia_Obj_t *)0x0;
  Gia_ManIncrementTravId(p);
  pObj_00 = Gia_ManConst0(p);
  Gia_ObjSetTravIdCurrent(p,pObj_00);
  iResult = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vLeaves);
    bVar5 = false;
    if (iResult < iVar1) {
      iVar1 = Vec_IntEntry(vLeaves,iResult);
      local_40 = Gia_ManObj(p,iVar1);
      bVar5 = local_40 != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    Gia_ObjSetTravIdCurrent(p,local_40);
    iResult = iResult + 1;
  }
  vNodes_00 = Vec_IntAlloc(100);
  iVar1 = Gia_ManSpeedupObj_rec(p,pObj,vNodes_00);
  if (iVar1 == 0) {
    printf("Bad node!!!\n");
    Vec_IntFree(vNodes_00);
  }
  else {
    iVar1 = Vec_IntSize(vTimes);
    iVar1 = 1 << ((byte)iVar1 & 0x1f);
    for (iResult = 0; iResult < iVar1; iResult = iResult + 1) {
      iObj = 0;
      while( true ) {
        iVar2 = Vec_IntSize(vLeaves);
        bVar5 = false;
        if (iObj < iVar2) {
          iVar2 = Vec_IntEntry(vLeaves,iObj);
          local_40 = Gia_ManObj(p,iVar2);
          bVar5 = local_40 != (Gia_Obj_t *)0x0;
        }
        if (!bVar5) break;
        iVar2 = Gia_ObjId(p,local_40);
        uVar4 = Abc_Var2Lit(iVar2,0);
        local_40->Value = uVar4;
        iObj = iObj + 1;
      }
      iObj = 0;
      while( true ) {
        iVar2 = Vec_IntSize(vTimes);
        bVar5 = false;
        if (iObj < iVar2) {
          iVar2 = Vec_IntEntry(vTimes,iObj);
          local_40 = Gia_ManObj(p,iVar2);
          bVar5 = local_40 != (Gia_Obj_t *)0x0;
        }
        if (!bVar5) break;
        local_40->Value = (uint)((iResult & 1 << ((byte)iObj & 0x1f)) != 0);
        iObj = iObj + 1;
      }
      iObj = 0;
      while( true ) {
        iVar2 = Vec_IntSize(vNodes_00);
        bVar5 = false;
        if (iObj < iVar2) {
          iVar2 = Vec_IntEntry(vNodes_00,iObj);
          local_40 = Gia_ManObj(p,iVar2);
          bVar5 = local_40 != (Gia_Obj_t *)0x0;
        }
        if (!bVar5) break;
        iVar2 = Gia_ObjFanin0Copy(local_40);
        iVar3 = Gia_ObjFanin1Copy(local_40);
        uVar4 = Gia_ManHashAnd(pNew,iVar2,iVar3);
        local_40->Value = uVar4;
        iObj = iObj + 1;
      }
      (&nSkip)[iResult] = local_40->Value;
    }
    Vec_IntFree(vNodes_00);
    iObj = 0;
    while( true ) {
      iVar2 = Vec_IntSize(vTimes);
      bVar5 = false;
      if (iObj < iVar2) {
        iVar2 = Vec_IntEntry(vTimes,iObj);
        local_40 = Gia_ManObj(p,iVar2);
        bVar5 = local_40 != (Gia_Obj_t *)0x0;
      }
      if (!bVar5) break;
      iVar2 = 1 << ((byte)iObj & 0x1f);
      for (iResult = 0; iResult < iVar1; iResult = iVar2 * 2 + iResult) {
        iVar3 = Gia_ObjToLit(p,local_40);
        iVar3 = Gia_ManHashMux(pNew,iVar3,(&nSkip)[iResult + iVar2],(&nSkip)[iResult]);
        (&nSkip)[iResult] = iVar3;
      }
      iObj = iObj + 1;
    }
    iVar1 = Gia_ObjId(p,pObj);
    iVar2 = Abc_Lit2Var(nSkip);
    if (iVar1 < iVar2) {
      Gia_ObjSetRepr(pNew,iVar2,iVar1);
      iVar3 = Gia_ObjNext(pNew,iVar1);
      Gia_ObjSetNext(pNew,iVar2,iVar3);
      Gia_ObjSetNext(pNew,iVar1,iVar2);
    }
  }
  return;
}

Assistant:

void Gia_ManSpeedupObj( Gia_Man_t * pNew, Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vLeaves, Vec_Int_t * vTimes )
{
    Vec_Int_t * vNodes;
    Gia_Obj_t * pTemp = NULL;
    int pCofs[32], nCofs, nSkip, i, k, iResult, iObj;
    // mark the leaves
    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrent( p, Gia_ManConst0(p) );
    Gia_ManForEachObjVec( vLeaves, p, pTemp, i )
        Gia_ObjSetTravIdCurrent( p, pTemp );
    // collect the AIG nodes
    vNodes = Vec_IntAlloc( 100 );
    if ( !Gia_ManSpeedupObj_rec( p, pObj, vNodes ) )
    {
        printf( "Bad node!!!\n" );
        Vec_IntFree( vNodes );
        return;
    }
    // derive cofactors
    nCofs = (1 << Vec_IntSize(vTimes));
    for ( i = 0; i < nCofs; i++ )
    {
        Gia_ManForEachObjVec( vLeaves, p, pTemp, k )
            pTemp->Value = Abc_Var2Lit( Gia_ObjId(p, pTemp), 0 );
        Gia_ManForEachObjVec( vTimes, p, pTemp, k )
            pTemp->Value = ((i & (1<<k)) != 0);
        Gia_ManForEachObjVec( vNodes, p, pTemp, k )
            pTemp->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pTemp), Gia_ObjFanin1Copy(pTemp) );
        pCofs[i] = pTemp->Value;
    }
    Vec_IntFree( vNodes );
    // collect the resulting tree
    Gia_ManForEachObjVec( vTimes, p, pTemp, k )
        for ( nSkip = (1<<k), i = 0; i < nCofs; i += 2*nSkip )
            pCofs[i] = Gia_ManHashMux( pNew, Gia_ObjToLit(p,pTemp), pCofs[i+nSkip], pCofs[i] );
    // create choice node  (pObj is repr and ppCofs[0] is new)
    iObj    = Gia_ObjId( p, pObj );
    iResult = Abc_Lit2Var( pCofs[0] );
    if ( iResult <= iObj )
        return;
    Gia_ObjSetRepr( pNew, iResult, iObj );
    Gia_ObjSetNext( pNew, iResult, Gia_ObjNext(pNew, iObj) );
    Gia_ObjSetNext( pNew, iObj, iResult );
}